

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPetNet.cpp
# Opt level: O1

void NaPetriNet::user_break(int signum)

{
  sigaction sa_old;
  sigaction sa;
  sigaction local_140;
  sigaction local_a8;
  
  bUserBreak = true;
  local_a8.__sigaction_handler.sa_handler = user_break;
  local_a8.sa_flags = -0x80000000;
  sigaction(2,&local_a8,&local_140);
  sigaction(0xf,&local_a8,&local_140);
  sigaction(3,&local_a8,&local_140);
  return;
}

Assistant:

void
NaPetriNet::user_break (int signum)
{
    bUserBreak = true;

    // Repeat register the signal handler oncve again
    struct sigaction	sa, sa_old;
    sa.sa_handler = user_break;
    sa.sa_flags = SA_ONESHOT;
    sigaction(SIGINT, &sa, &sa_old);
    sigaction(SIGTERM, &sa, &sa_old);
    sigaction(SIGQUIT, &sa, &sa_old);
}